

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxels.cpp
# Opt level: O1

void R_InitVoxels(void)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  FVoxelDef *def;
  char *pcVar4;
  ulong uVar5;
  FVoxel *unaff_R12;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int j;
  bool bVar9;
  undefined4 uVar10;
  TArray<unsigned_int,_unsigned_int> vsprites;
  int lastlump;
  FScanner sc;
  TArray<unsigned_int,_unsigned_int> local_168;
  double local_158;
  int local_14c;
  undefined1 local_148 [16];
  FScanner local_130;
  
  local_14c = 0;
  iVar2 = FWadCollection::FindLump(&Wads,"VOXELDEF",&local_14c,false);
  if (iVar2 != -1) {
    do {
      FScanner::FScanner(&local_130,iVar2);
      local_168.Array = (uint *)0x0;
      local_168.Most = 0;
      local_168.Count = 0;
LAB_0068efe8:
      if (local_168.Count != 0) {
        local_168._8_8_ = local_168._8_8_ & 0xffffffff;
      }
      bVar1 = FScanner::GetString(&local_130);
      while (pcVar4 = local_130.String, bVar1 != false) {
        unaff_R12 = (FVoxel *)pcVar4;
        if ((char)*(int *)local_130.String == '=') {
          if (local_168.Count == 0) {
            FScanner::ScriptMessage(&local_130,"No sprites specified for voxel.\n");
          }
          goto LAB_0068f108;
        }
        if ((local_130.StringLen & 0xfffffffeU) == 4) {
          if (local_130.StringLen == 5) {
            iVar2 = toupper((int)(char)*(int *)((long)local_130.String + 4));
            *(char *)((long)pcVar4 + 4) = (char)iVar2;
            if ((byte)((char)*(int *)((long)local_130.String + 4) + 0xa2U) < 0xe3) {
              FScanner::ScriptMessage(&local_130,"Sprite frame %s is invalid.\n");
              goto LAB_0068f0c9;
            }
          }
          uVar7 = 0xff000000;
          if (local_130.StringLen != 4) {
            uVar7 = (uint)(byte)*(int *)((long)local_130.String + 4) * 0x1000000 + 0xbf000000;
          }
          uVar3 = GetSpriteIndex(local_130.String,false);
          if (uVar3 != 0xffffffff) {
            TArray<unsigned_int,_unsigned_int>::Grow(&local_168,1);
            local_168.Array[local_168.Count] = uVar3 | uVar7;
            local_168.Count = local_168.Count + 1;
          }
        }
        else {
          FScanner::ScriptMessage(&local_130,"Sprite name \"%s\" is wrong size.\n",local_130.String)
          ;
        }
LAB_0068f0c9:
        bVar1 = FScanner::GetString(&local_130);
      }
      if (local_168.Count != 0) {
        FScanner::ScriptMessage(&local_130,"Unexpected end of file\n");
      }
LAB_0068f108:
      if (bVar1 != false) {
        FScanner::SetCMode(&local_130,true);
        FScanner::MustGetToken(&local_130,0x102);
        iVar2 = FWadCollection::CheckNumForFullName(&Wads,local_130.String,true,0xb);
        pcVar4 = "Voxel \"%s\" not found.\n";
        if (iVar2 < 0) {
LAB_0068f1fa:
          FScanner::ScriptMessage(&local_130,pcVar4,local_130.String);
          unaff_R12 = (FVoxel *)0x0;
        }
        else {
          uVar8 = (ulong)Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Count;
          bVar1 = uVar8 != 0;
          if (bVar1) {
            unaff_R12 = *Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Array;
            bVar1 = true;
            if ((unaff_R12->LumpNum != iVar2) &&
               (bVar1 = Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Count != 1,
               Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Count != 1)) {
              uVar5 = 2;
              do {
                unaff_R12 = Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Array[uVar5 - 1];
                if (unaff_R12->LumpNum == iVar2) break;
                bVar1 = uVar5 < uVar8;
                bVar9 = uVar5 != uVar8;
                uVar5 = uVar5 + 1;
              } while (bVar9);
            }
          }
          if ((!bVar1) && (unaff_R12 = R_LoadKVX(iVar2), unaff_R12 != (FVoxel *)0x0)) {
            TArray<FVoxel_*,_FVoxel_*>::Grow(&Voxels.super_TArray<FVoxel_*,_FVoxel_*>,1);
            Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Array
            [Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Count] = unaff_R12;
            Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Count =
                 Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Count + 1;
          }
          pcVar4 = "\"%s\" is not a valid voxel file.\n";
          if (unaff_R12 == (FVoxel *)0x0) goto LAB_0068f1fa;
        }
        bVar1 = FScanner::CheckToken(&local_130,0x7b);
        iVar6 = 0;
        local_148 = ZEXT816(0x4056800000000000);
        local_158 = 1.0;
        iVar2 = 0;
        bVar9 = false;
        if (bVar1) {
          bVar1 = FScanner::GetToken(&local_130);
          iVar6 = 0;
          local_148 = ZEXT816(0x4056800000000000);
          local_158 = 1.0;
          iVar2 = 0;
          bVar9 = false;
          if (bVar1) {
            iVar6 = 0;
            local_148 = ZEXT816(0x4056800000000000);
            local_158 = 1.0;
            iVar2 = 0;
            bVar9 = false;
            do {
              if (local_130.TokenType == 0x7d) goto LAB_0068f4e2;
              FScanner::TokenMustBe(&local_130,0x101);
              bVar1 = FScanner::Compare(&local_130,"scale");
              if (bVar1) {
                FScanner::MustGetToken(&local_130,0x3d);
                FScanner::MustGetToken(&local_130,0x106);
                local_158 = local_130.Float;
              }
              else {
                bVar1 = FScanner::Compare(&local_130,"spin");
                if (bVar1) {
                  FScanner::MustGetToken(&local_130,0x3d);
                  bVar1 = FScanner::CheckToken(&local_130,0x2d);
                  FScanner::MustGetToken(&local_130,0x104);
                  iVar2 = -local_130.Number;
                  iVar6 = -local_130.Number;
                  if (!bVar1) {
                    iVar2 = local_130.Number;
                    iVar6 = local_130.Number;
                  }
                }
                else {
                  bVar1 = FScanner::Compare(&local_130,"placedspin");
                  if (bVar1) {
                    FScanner::MustGetToken(&local_130,0x3d);
                    bVar1 = FScanner::CheckToken(&local_130,0x2d);
                    FScanner::MustGetToken(&local_130,0x104);
                    iVar6 = -local_130.Number;
                    if (!bVar1) {
                      iVar6 = local_130.Number;
                    }
                  }
                  else {
                    bVar1 = FScanner::Compare(&local_130,"droppedspin");
                    if (bVar1) {
                      FScanner::MustGetToken(&local_130,0x3d);
                      bVar1 = FScanner::CheckToken(&local_130,0x2d);
                      FScanner::MustGetToken(&local_130,0x104);
                      iVar2 = -local_130.Number;
                      if (!bVar1) {
                        iVar2 = local_130.Number;
                      }
                    }
                    else {
                      bVar1 = FScanner::Compare(&local_130,"angleoffset");
                      if (bVar1) {
                        FScanner::MustGetToken(&local_130,0x3d);
                        bVar1 = FScanner::CheckToken(&local_130,0x2d);
                        FScanner::MustGetAnyToken(&local_130);
                        if (local_130.TokenType == 0x104) {
                          local_130.Float = (double)local_130.Number;
                        }
                        else {
                          FScanner::TokenMustBe(&local_130,0x106);
                        }
                        uVar10 = 0;
                        uVar7 = local_130.Float._4_4_;
                        if (bVar1) {
                          uVar10 = 0x80000000;
                          uVar7 = local_130.Float._4_4_ ^ 0x80000000;
                        }
                        local_148._8_4_ = 0;
                        local_148._0_8_ = (double)CONCAT44(uVar7,local_130.Float._0_4_) + 90.0;
                        local_148._12_4_ = uVar10;
                      }
                      else {
                        bVar1 = FScanner::Compare(&local_130,"overridepalette");
                        if (bVar1) {
                          bVar9 = true;
                        }
                        else {
                          FScanner::ScriptMessage
                                    (&local_130,"Unknown voxel option \'%s\'\n",local_130.String);
                          bVar1 = FScanner::CheckToken(&local_130,0x3d);
                          if (bVar1) {
                            FScanner::MustGetAnyToken(&local_130);
                          }
                        }
                      }
                    }
                  }
                }
              }
              bVar1 = FScanner::GetToken(&local_130);
            } while (bVar1);
          }
          FScanner::ScriptMessage(&local_130,"Unterminated voxel option block\n");
        }
LAB_0068f4e2:
        FScanner::SetCMode(&local_130,false);
        if ((unaff_R12 != (FVoxel *)0x0) && (local_168.Count != 0)) {
          if ((bVar9) && (unaff_R12->Palette != (BYTE *)0x0)) {
            operator_delete__(unaff_R12->Palette);
            unaff_R12->Palette = (BYTE *)0x0;
          }
          def = (FVoxelDef *)operator_new(0x28);
          def->Voxel = unaff_R12;
          def->Scale = local_158;
          def->DroppedSpin = iVar2;
          def->PlacedSpin = iVar6;
          (def->AngleOffset).Degrees = (double)local_148._0_8_;
          TArray<FVoxelDef_*,_FVoxelDef_*>::Grow
                    (&VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>,1);
          VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>.Array
          [VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>.Count] = def;
          VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>.Count =
               VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>.Count + 1;
          if (local_168.Count != 0) {
            uVar8 = 0;
            do {
              uVar3 = local_168.Array[uVar8] & 0xffffff;
              unaff_R12 = (FVoxel *)(ulong)uVar3;
              uVar7 = local_168.Array[uVar8] >> 0x18;
              if (uVar7 == 0xff) {
                iVar2 = 0x1c;
                do {
                  VOX_AddVoxel(uVar3,iVar2,def);
                  bVar1 = iVar2 != 0;
                  iVar2 = iVar2 + -1;
                } while (bVar1);
              }
              else {
                VOX_AddVoxel(uVar3,uVar7,def);
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 < (ulong)local_168._8_8_ >> 0x20);
          }
        }
        goto LAB_0068efe8;
      }
      TArray<unsigned_int,_unsigned_int>::~TArray(&local_168);
      FScanner::~FScanner(&local_130);
      iVar2 = FWadCollection::FindLump(&Wads,"VOXELDEF",&local_14c,false);
    } while (iVar2 != -1);
  }
  return;
}

Assistant:

void R_InitVoxels()
{
	int lump, lastlump = 0;
	
	while ((lump = Wads.FindLump("VOXELDEF", &lastlump)) != -1)
	{
		FScanner sc(lump);
		TArray<DWORD> vsprites;

		while (VOX_ReadSpriteNames(sc, vsprites))
		{
			FVoxel *voxeldata = NULL;
			int voxelfile;
			VoxelOptions opts;

			sc.SetCMode(true);
			sc.MustGetToken(TK_StringConst);
			voxelfile = Wads.CheckNumForFullName(sc.String, true, ns_voxels);
			if (voxelfile < 0)
			{
				sc.ScriptMessage("Voxel \"%s\" not found.\n", sc.String);
			}
			else
			{
				voxeldata = VOX_GetVoxel(voxelfile);
				if (voxeldata == NULL)
				{
					sc.ScriptMessage("\"%s\" is not a valid voxel file.\n", sc.String);
				}
			}
			if (sc.CheckToken('{'))
			{
				VOX_ReadOptions(sc, opts);
			}
			sc.SetCMode(false);
			if (voxeldata != NULL && vsprites.Size() != 0)
			{
				if (opts.OverridePalette)
				{
					voxeldata->RemovePalette();
				}
				FVoxelDef *def = new FVoxelDef;

				def->Voxel = voxeldata;
				def->Scale = opts.Scale;
				def->DroppedSpin = opts.DroppedSpin;
				def->PlacedSpin = opts.PlacedSpin;
				def->AngleOffset = opts.AngleOffset;
				VoxelDefs.Push(def);

				for (unsigned i = 0; i < vsprites.Size(); ++i)
				{
					int sprnum = int(vsprites[i] & 0xFFFFFF);
					int frame = int(vsprites[i] >> 24);
					if (frame == 255)
					{ // Apply voxel to all frames.
						for (int j = MAX_SPRITE_FRAMES - 1; j >= 0; --j)
						{
							VOX_AddVoxel(sprnum, j, def);
						}
					}
					else
					{ // Apply voxel to only one frame.
						VOX_AddVoxel(sprnum, frame, def);
					}
				}
			}
		}
	}
}